

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_region_init_io_s390x
               (uc_struct_conflict14 *uc,MemoryRegion_conflict *mr,MemoryRegionOps *ops,void *opaque
               ,uint64_t size)

{
  memory_region_init_s390x(uc,mr,size);
  if (ops == (MemoryRegionOps *)0x0) {
    ops = &unassigned_mem_ops_s390x;
  }
  mr->ops = ops;
  mr->opaque = opaque;
  mr->terminates = true;
  return;
}

Assistant:

void memory_region_init_io(struct uc_struct *uc,
                           MemoryRegion *mr,
                           const MemoryRegionOps *ops,
                           void *opaque,
                           uint64_t size)
{
    memory_region_init(uc, mr, size);
    mr->ops = ops ? ops : &unassigned_mem_ops;
    mr->opaque = opaque;
    mr->terminates = true;
}